

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SetDataPdu.cpp
# Opt level: O0

void __thiscall DIS::SetDataPdu::marshal(SetDataPdu *this,DataStream *dataStream)

{
  undefined8 uVar1;
  size_type sVar2;
  const_reference pvVar3;
  const_reference pvVar4;
  undefined1 local_78 [8];
  VariableDatum x_1;
  size_t idx_1;
  undefined1 local_30 [8];
  FixedDatum x;
  size_t idx;
  DataStream *dataStream_local;
  SetDataPdu *this_local;
  
  SimulationManagementFamilyPdu::marshal(&this->super_SimulationManagementFamilyPdu,dataStream);
  DataStream::operator<<(dataStream,this->_requestID);
  DataStream::operator<<(dataStream,this->_padding1);
  sVar2 = std::vector<DIS::FixedDatum,_std::allocator<DIS::FixedDatum>_>::size(&this->_fixedDatums);
  DataStream::operator<<(dataStream,(uint)sVar2);
  sVar2 = std::vector<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>::size
                    (&this->_variableDatums);
  DataStream::operator<<(dataStream,(uint)sVar2);
  x._fixedDatumID = 0;
  x._fixedDatumValue = 0;
  while( true ) {
    uVar1 = x._8_8_;
    sVar2 = std::vector<DIS::FixedDatum,_std::allocator<DIS::FixedDatum>_>::size
                      (&this->_fixedDatums);
    if (sVar2 <= (ulong)uVar1) break;
    pvVar3 = std::vector<DIS::FixedDatum,_std::allocator<DIS::FixedDatum>_>::operator[]
                       (&this->_fixedDatums,x._8_8_);
    FixedDatum::FixedDatum((FixedDatum *)local_30,pvVar3);
    FixedDatum::marshal((FixedDatum *)local_30,dataStream);
    FixedDatum::~FixedDatum((FixedDatum *)local_30);
    x._8_8_ = x._8_8_ + 1;
  }
  x_1._arrayLength = 0;
  x_1._44_4_ = 0;
  while( true ) {
    uVar1 = x_1._40_8_;
    sVar2 = std::vector<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>::size
                      (&this->_variableDatums);
    if (sVar2 <= (ulong)uVar1) break;
    pvVar4 = std::vector<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>::operator[]
                       (&this->_variableDatums,x_1._40_8_);
    VariableDatum::VariableDatum((VariableDatum *)local_78,pvVar4);
    VariableDatum::marshal((VariableDatum *)local_78,dataStream);
    VariableDatum::~VariableDatum((VariableDatum *)local_78);
    x_1._40_8_ = x_1._40_8_ + 1;
  }
  return;
}

Assistant:

void SetDataPdu::marshal(DataStream& dataStream) const
{
    SimulationManagementFamilyPdu::marshal(dataStream); // Marshal information in superclass first
    dataStream << _requestID;
    dataStream << _padding1;
    dataStream << ( unsigned int )_fixedDatums.size();
    dataStream << ( unsigned int )_variableDatums.size();

     for(size_t idx = 0; idx < _fixedDatums.size(); idx++)
     {
        FixedDatum x = _fixedDatums[idx];
        x.marshal(dataStream);
     }


     for(size_t idx = 0; idx < _variableDatums.size(); idx++)
     {
        VariableDatum x = _variableDatums[idx];
        x.marshal(dataStream);
     }

}